

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_zone(REF_HISTOGRAM ref_histogram,FILE *file,char *zone_title,REF_DBL time)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double local_80;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_DBL center;
  REF_DBL portion;
  REF_DBL area;
  REF_DBL norm;
  REF_INT sum;
  REF_INT i;
  REF_DBL time_local;
  char *zone_title_local;
  FILE *file_local;
  REF_HISTOGRAM ref_histogram_local;
  
  norm._0_4_ = 0;
  for (norm._4_4_ = 0; norm._4_4_ < ref_histogram->nbin; norm._4_4_ = norm._4_4_ + 1) {
    norm._0_4_ = ref_histogram->bins[norm._4_4_] + norm._0_4_;
  }
  area = 0.0;
  if (0 < norm._0_4_) {
    area = 1.0 / (double)norm._0_4_;
  }
  if (zone_title == (char *)0x0) {
    fprintf((FILE *)file,"ZONE I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",time,
            (ulong)(ref_histogram->nbin - 2));
  }
  else {
    fprintf((FILE *)file,"ZONE T=\"%s\", I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",time,zone_title
            ,(ulong)(ref_histogram->nbin - 2));
  }
  for (norm._4_4_ = 0; norm._4_4_ < ref_histogram->nbin + -2; norm._4_4_ = norm._4_4_ + 1) {
    dVar3 = pow(2.0,(1.0 / ref_histogram->exp) *
                    (double)((norm._4_4_ + 1) - ref_histogram->nbin / 2));
    dVar4 = pow(2.0,(1.0 / ref_histogram->exp) * (double)(norm._4_4_ - ref_histogram->nbin / 2));
    local_80 = ((double)ref_histogram->bins[norm._4_4_] / (dVar3 - dVar4)) * area;
    if (local_80 <= 1e-20) {
      local_80 = 1e-20;
    }
    dVar3 = pow(2.0,(1.0 / ref_histogram->exp) * (double)(norm._4_4_ - ref_histogram->nbin / 2));
    dVar4 = pow(2.0,(1.0 / ref_histogram->exp) *
                    (double)((norm._4_4_ + 1) - ref_histogram->nbin / 2));
    fprintf((FILE *)file,"%.8e %.8e\n",(dVar3 + dVar4) * 0.5,local_80);
  }
  iVar1 = fflush((FILE *)file);
  lVar2 = (long)iVar1;
  if (lVar2 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x132,"ref_histogram_zone","tec zone fflush",0,lVar2);
  }
  ref_histogram_local._4_4_ = (uint)(lVar2 != 0);
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_zone(REF_HISTOGRAM ref_histogram, FILE *file,
                                      const char *zone_title, REF_DBL time) {
  REF_INT i;
  REF_INT sum;
  REF_DBL norm, area, portion, center;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  if (NULL == zone_title) {
    fprintf(file, "ZONE I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",
            ref_histogram_nbin(ref_histogram) - 2, time);
  } else {
    fprintf(file, "ZONE T=\"%s\", I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",
            zone_title, ref_histogram_nbin(ref_histogram) - 2, time);
  }
  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 2; i++) {
    area = ref_histogram_to_obs(i + 1) - ref_histogram_to_obs(i);
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) / area * norm;
    portion = MAX(portion, 1.0e-20);
    center = 0.5 * (ref_histogram_to_obs(i) + ref_histogram_to_obs(i + 1));
    fprintf(file, "%.8e %.8e\n", center, portion);
  }
  REIS(0, fflush(file), "tec zone fflush");

  return REF_SUCCESS;
}